

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O2

void set_error(aom_internal_error_info *info,aom_codec_err_t error,char *fmt,__va_list_tag *ap)

{
  info->error_code = error;
  info->has_detail = 0;
  if (fmt != (char *)0x0) {
    info->has_detail = 1;
    vsnprintf(info->detail,199,fmt,ap);
    info->detail[199] = '\0';
  }
  return;
}

Assistant:

static void set_error(struct aom_internal_error_info *info,
                      aom_codec_err_t error, const char *fmt, va_list ap) {
  info->error_code = error;
  info->has_detail = 0;

  if (fmt) {
    size_t sz = sizeof(info->detail);

    info->has_detail = 1;
    vsnprintf(info->detail, sz - 1, fmt, ap);
    info->detail[sz - 1] = '\0';
  }
}